

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Parser::ParseLibraryDeclaration(Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  Library *__tmp;
  String libraryName;
  undefined1 local_60 [32];
  String local_40;
  
  if ((this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    Error<>(this,"Library has already been declared for this script");
    return;
  }
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if (((this->m_error == false) &&
      (pSVar2 = (this->m_currentSymbol)._M_current,
      pSVar2 != (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish)) && (pSVar2->type == Library)) {
    this->m_lastLine = pSVar2->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar2 + 1;
    ParseName_abi_cxx11_((String *)local_60,this);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              (&local_40,
               (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_60);
    if ((element_type *)local_60._0_8_ != (element_type *)(local_60 + 0x10)) {
      MemFree((void *)local_60._0_8_,(size_t)(local_60._16_8_ + 1));
    }
    if (local_40._M_string_length == 0) {
      Error<>(this,"Expected valid name after \'library\' keyword");
      goto LAB_00126c9e;
    }
    Expect(this,NewLine,(char *)0x0);
    Runtime::GetLibrary((Runtime *)local_60,
                        (String *)
                        (this->m_runtime).
                        super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar5 = local_60._8_8_;
    uVar4 = local_60._0_8_;
    if ((element_type *)local_60._8_8_ != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_60._8_8_ + 8))->
                 _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_60._8_8_ + 8))->
                      _M_weak_this).
                      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        UNLOCK();
        if ((element_type *)local_60._8_8_ == (element_type *)0x0) goto LAB_00126d87;
      }
      else {
        *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_60._8_8_ + 8))->
                 _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_60._8_8_ + 8))->
                      _M_weak_this).
                      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
    }
LAB_00126d87:
    (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar4;
    p_Var3 = (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
  }
  EmitOpcode(this,Library);
  BinaryWriter::Write(&this->m_writer,&local_40);
  Runtime::GetLibrary((Runtime *)local_60,
                      (String *)
                      (this->m_runtime).
                      super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((element_type *)local_60._8_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_60._8_8_ + 8))->_M_weak_this
               ).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_60._8_8_ + 8))->
                    _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
      UNLOCK();
      if ((element_type *)local_60._8_8_ == (element_type *)0x0) goto LAB_00126c7f;
    }
    else {
      *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_60._8_8_ + 8))->_M_weak_this
               ).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_60._8_8_ + 8))->
                    _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
LAB_00126c7f:
  (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_60._0_8_;
  p_Var3 = (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
LAB_00126c9e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    MemFree(local_40._M_dataplus._M_p,
            CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,local_40.field_2._M_local_buf[0])
            + 1);
  }
  return;
}

Assistant:

inline_t void Parser::ParseLibraryDeclaration()
	{
		if (m_library != nullptr)
		{
			Error("Library has already been declared for this script");
			return;
		}
		String libraryName;
		if (Accept(SymbolType::Library))
		{
			libraryName = ParseName();
			if (libraryName.empty())
			{
				Error("Expected valid name after 'library' keyword");
				return;
			}
			Expect(SymbolType::NewLine);
			m_library = m_runtime->GetLibraryInternal(libraryName);
		}

		// Emit library declaration bytecode
		EmitOpcode(Opcode::Library);
		EmitName(libraryName);

		// Retrieve library interface by name
		m_library = m_runtime->GetLibraryInternal(libraryName);
	}